

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

double __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::CalcPeaks
          (ChISO2631_Shock_SeatCushionLogger *this,vector<double,_std::allocator<double>_> *v,
          bool vertical)

{
  pointer pdVar1;
  size_t k;
  ulong uVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  double __x;
  double dVar6;
  double dVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar8 [64];
  
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar7 = 0.0;
  if ((long)pdVar3 - (long)pdVar1 != 8) {
    uVar5 = 1;
    uVar4 = 0;
    uVar2 = 0;
    dVar7 = 0.0;
    do {
      dVar6 = pdVar1[uVar4];
      if (((0.0 < dVar6) && (pdVar1[uVar4 + 1] < 0.0)) ||
         ((dVar6 < 0.0 && (0.0 < pdVar1[uVar4 + 1])))) {
        __x = 0.0;
        auVar8 = ZEXT864(0);
        if (dVar6 < 0.0 && !vertical) {
          if (uVar2 <= uVar4) {
            do {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = pdVar1[uVar2];
              uVar2 = uVar2 + 1;
              auVar10 = vminsd_avx(auVar10,auVar8._0_16_);
              auVar8 = ZEXT1664(auVar10);
              __x = auVar10._0_8_;
            } while (uVar5 != uVar2);
          }
        }
        else if (uVar2 <= uVar4) {
          do {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = pdVar1[uVar2];
            uVar2 = uVar2 + 1;
            auVar10 = vmaxsd_avx(auVar9,auVar8._0_16_);
            auVar8 = ZEXT1664(auVar10);
            __x = auVar10._0_8_;
          } while (uVar5 != uVar2);
        }
        dVar6 = pow(__x,6.0);
        pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        dVar7 = dVar7 + dVar6;
        uVar2 = uVar4;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar4 < ((long)pdVar3 - (long)pdVar1 >> 3) - 1U);
  }
  dVar7 = pow(dVar7,0.16666666666666666);
  return dVar7;
}

Assistant:

double ChISO2631_Shock_SeatCushionLogger::CalcPeaks(std::vector<double>& v, bool vertical) {
    double d = 0.0;
    size_t id1 = 0;
    size_t id2 = 0;
    double mx;
    for (size_t i = 0; i < v.size() - 1; i++) {
        id2 = i;
        if ((v[i] > 0 && v[i + 1] < 0) || (v[i] < 0 && v[i + 1] > 0)) {
            if (v[id2] < 0 && !vertical) {
                mx = 0.0;
                for (size_t k = id1; k <= id2; k++) {
                    if (v[k] < mx) {
                        mx = v[k];
                    }
                }
            } else {
                mx = 0.0;
                for (size_t k = id1; k <= id2; k++) {
                    if (v[k] > mx) {
                        mx = v[k];
                    }
                }
            }
            d += pow(mx, 6.0);
            id1 = id2;
        }
    }

    return pow(d, 1.0 / 6.0);
}